

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

void luaV_settable(lua_State *L,TValue *t,TValue *key,StkId val)

{
  int iVar1;
  GCObject *t_00;
  global_State *pgVar2;
  Table *events;
  Value *pVVar3;
  StkId pTVar4;
  bool bVar5;
  TValue *pTVar6;
  TValue *o2_2;
  Value *unaff_R13;
  TValue *o2_1;
  int iVar7;
  TValue *o1;
  TValue *o2;
  TValue *o2_3;
  TValue temp;
  Value local_40;
  int local_38;
  
  iVar7 = 100;
  do {
    iVar1 = ((Value *)((long)t + 8))->b;
    if ((long)iVar1 == 5) {
      t_00 = *(GCObject **)t;
      pTVar6 = luaH_set(L,&t_00->h,key);
      if (pTVar6->tt == 0) {
        events = (t_00->h).metatable;
        if ((events == (Table *)0x0) || ((events->flags & 2) != 0)) {
          unaff_R13 = (Value *)0x0;
        }
        else {
          unaff_R13 = &luaT_gettm(events,TM_NEWINDEX,L->l_G->tmname[1])->value;
        }
        bVar5 = true;
        if (unaff_R13 == (Value *)0x0) {
          unaff_R13 = (Value *)0x0;
          goto LAB_00107017;
        }
      }
      else {
LAB_00107017:
        pTVar6->value = val->value;
        pTVar6->tt = val->tt;
        (t_00->h).flags = '\0';
        if (((3 < val->tt) && (((((val->value).gc)->gch).marked & 3) != 0)) &&
           (((t_00->gch).marked & 4) != 0)) {
          pgVar2 = L->l_G;
          (t_00->gch).marked = (t_00->gch).marked & 0xfb;
          (t_00->h).gclist = pgVar2->grayagain;
          pgVar2->grayagain = t_00;
        }
        bVar5 = false;
      }
      if (bVar5) goto LAB_001070be;
      bVar5 = false;
    }
    else {
      unaff_R13 = &luaT_gettmbyobj(L,t,TM_NEWINDEX)->value;
      if (unaff_R13[1].b == 0) {
        luaG_runerror(L,"attempt to %s a %s value","index",luaT_typenames[iVar1]);
      }
LAB_001070be:
      if (unaff_R13[1].b == 6) {
        pVVar3 = &L->top->value;
        *pVVar3 = *unaff_R13;
        pVVar3[1].b = unaff_R13[1].b;
        pTVar4 = L->top;
        pTVar4[1].value = t->value;
        pTVar4[1].tt = ((Value *)((long)t + 8))->b;
        pTVar4 = L->top;
        pTVar4[2].value = key->value;
        pTVar4[2].tt = key->tt;
        pTVar4 = L->top;
        pTVar4[3].value = val->value;
        pTVar4[3].tt = val->tt;
        if ((long)L->stack_last - (long)L->top < 0x41) {
          luaD_growstack(L,4);
        }
        pTVar4 = L->top;
        L->top = pTVar4 + 4;
        bVar5 = false;
        luaD_call(L,pTVar4,0);
      }
      else {
        local_40 = *unaff_R13;
        local_38 = unaff_R13[1].b;
        bVar5 = true;
        t = (TValue *)&local_40;
      }
    }
    if (!bVar5) {
      return;
    }
    iVar7 = iVar7 + -1;
    if (iVar7 == 0) {
      luaG_runerror(L,"loop in settable");
    }
  } while( true );
}

Assistant:

static void luaV_settable(lua_State*L,const TValue*t,TValue*key,StkId val){
int loop;
TValue temp;
for(loop=0;loop<100;loop++){
const TValue*tm;
if(ttistable(t)){
Table*h=hvalue(t);
TValue*oldval=luaH_set(L,h,key);
if(!ttisnil(oldval)||
(tm=fasttm(L,h->metatable,TM_NEWINDEX))==NULL){
setobj(L,oldval,val);
h->flags=0;
luaC_barriert(L,h,val);
return;
}
}
else if(ttisnil(tm=luaT_gettmbyobj(L,t,TM_NEWINDEX)))
luaG_typeerror(L,t,"index");
if(ttisfunction(tm)){
callTM(L,tm,t,key,val);
return;
}
setobj(L,&temp,tm);
t=&temp;
}
luaG_runerror(L,"loop in settable");
}